

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayTex3DValidation.cpp
# Opt level: O2

IterateResult __thiscall
glcts::TextureCubeMapArrayTex3DValidation::iterate(TextureCubeMapArrayTex3DValidation *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  char *description;
  qpTestResult testResult;
  TestContext *this_01;
  undefined8 in_stack_ffffffffffffffa8;
  uint uVar10;
  undefined8 in_stack_ffffffffffffffb0;
  undefined4 uVar11;
  undefined8 in_stack_ffffffffffffffb8;
  undefined4 uVar12;
  long lVar9;
  
  uVar10 = (uint)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  uVar11 = (undefined4)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  uVar12 = (undefined4)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  if ((this->super_TestCaseBase).m_is_texture_cube_map_array_supported == false) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Texture cube map array functionality not supported, skipping",
               fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayTex3DValidation.cpp"
               ,0x4e);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  iVar8 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar8);
  createTexture(this);
  (**(code **)(lVar9 + 0x1320))
            (0x9009,0,0x8058,4,4,6,(ulong)uVar10 << 0x20,CONCAT44(uVar11,0x1908),
             CONCAT44(uVar12,0x1401),0);
  bVar1 = checkError(this,0,"glTexImage3D() call failed when called with valid arguments - ");
  (**(code **)(lVar9 + 0x1398))(0x9009,1,0x8058,4,4,6);
  bVar2 = checkError(this,0,"glTexStorage3D() call failed when called with valid arguments - ");
  deleteTexture(this);
  createTexture(this);
  (**(code **)(lVar9 + 0x1320))(0x9009,0,0x8058,4,3,6,0,0x1908,0x1401,0);
  bVar3 = checkError(this,0x501,
                     "glTexImage3D() call generated an invalid error code when width != height - ");
  (**(code **)(lVar9 + 0x1398))(0x9009,1,0x8058,4,3,6);
  bVar4 = checkError(this,0x501,
                     "glTexStorage3D() call generated an invalid error code when width != height - "
                    );
  deleteTexture(this);
  createTexture(this);
  (**(code **)(lVar9 + 0x1320))(0x9009,0,0x8058,4,4,7,0,0x1908,0x1401,0);
  bVar5 = checkError(this,0x501,
                     "glTexImage3D() call generated an invalid error code when depth was not a multiple of six - "
                    );
  deleteTexture(this);
  createTexture(this);
  (**(code **)(lVar9 + 0x1398))(0x9009,1,0x8058,4,4,7);
  bVar6 = checkError(this,0x501,
                     "glTexStorage3D() call generated an invalid error code when depth was not a multiple of six - "
                    );
  deleteTexture(this);
  createTexture(this);
  (**(code **)(lVar9 + 0x1398))(0x9009,4,0x8058,4,4,6);
  bVar7 = checkError(this,0x502,
                     "glTexStorage3D() call generated an invalid error code when levels argument was greater than floor(log2(max(width, height))) + 1 - "
                    );
  if (bVar7) {
    deleteTexture(this);
    if ((bVar5 && bVar6) && ((bVar3 && bVar4) && (bVar1 && bVar2))) {
      this_01 = (this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
      goto LAB_00cc5a88;
    }
  }
  else {
    deleteTexture(this);
  }
  this_01 = (this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
  description = "Fail";
  testResult = QP_TEST_RESULT_FAIL;
LAB_00cc5a88:
  tcu::TestContext::setTestResult(this_01,testResult,description);
  return STOP;
}

Assistant:

tcu::TestCase::IterateResult TextureCubeMapArrayTex3DValidation::iterate()
{
	/* Check if GL_EXT_texture_cube_map_array extension is supported */
	if (!m_is_texture_cube_map_array_supported)
	{
		throw tcu::NotSupportedError(TEXTURE_CUBE_MAP_ARRAY_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	const glw::Functions& gl	 = m_context.getRenderContext().getFunctions();
	bool				  result = true;

	/* Check if GL_INVALID_VALUE is not set if width and height are equal */
	const glw::GLint correctWidth  = 4;
	const glw::GLint correctHeight = 4;
	const glw::GLint correctDepth  = 6;

	createTexture();
	gl.texImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, 0 /* level */, GL_RGBA8 /* internalformat*/, correctWidth, correctHeight,
				  correctDepth, 0 /* border */, GL_RGBA, GL_UNSIGNED_BYTE, DE_NULL);

	if (!checkError(GL_NO_ERROR, "glTexImage3D() call failed when called with valid arguments - "))
	{
		result = false;
	}

	gl.texStorage3D(GL_TEXTURE_CUBE_MAP_ARRAY, 1, /* levels */
					GL_RGBA8,					  /* internalformat*/
					correctWidth, correctHeight, correctDepth);

	if (!checkError(GL_NO_ERROR, "glTexStorage3D() call failed when called with valid arguments - "))
	{
		result = false;
	}

	deleteTexture();
	createTexture();

	/* Check if GL_INVALID_VALUE is set if width and height are not equal*/
	const glw::GLint incorrectWidth  = 4;
	const glw::GLint incorrectHeight = 3;

	gl.texImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, 0,						/* level */
				  GL_RGBA8,											/* internalformat*/
				  incorrectWidth, incorrectHeight, correctDepth, 0, /* border */
				  GL_RGBA, GL_UNSIGNED_BYTE, DE_NULL);

	if (!checkError(GL_INVALID_VALUE, "glTexImage3D() call generated an invalid error code when width != height - "))
	{
		result = false;
	}

	gl.texStorage3D(GL_TEXTURE_CUBE_MAP_ARRAY, 1, /* levels */
					GL_RGBA8,					  /* internalformat*/
					incorrectWidth, incorrectHeight, correctDepth);

	if (!checkError(GL_INVALID_VALUE, "glTexStorage3D() call generated an invalid error code "
									  "when width != height - "))
	{
		result = false;
	}

	deleteTexture();
	createTexture();

	/* Check if GL_INVALID_VALUE is set if depth is not a multiple of six */
	const glw::GLint incorrectDepth = 7;

	gl.texImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, 0,					  /* level */
				  GL_RGBA8,										  /* internalformat */
				  correctWidth, correctHeight, incorrectDepth, 0, /* border */
				  GL_RGBA, GL_UNSIGNED_BYTE, DE_NULL);

	if (!checkError(GL_INVALID_VALUE, "glTexImage3D() call generated an invalid error code"
									  " when depth was not a multiple of six - "))
	{
		result = false;
	}

	deleteTexture();
	createTexture();

	gl.texStorage3D(GL_TEXTURE_CUBE_MAP_ARRAY, 1, /* levels */
					GL_RGBA8,					  /* internalformat*/
					correctWidth, correctHeight, incorrectDepth);

	if (!checkError(GL_INVALID_VALUE, "glTexStorage3D() call generated an invalid error "
									  "code when depth was not a multiple of six - "))
	{
		result = false;
	}

	deleteTexture();
	createTexture();

	/* Check if GL_INVALID_OPERATION is set if levels argument is greater than floor(log2(max(width, height))) + 1*/
	const glw::GLfloat maxTextureSize = (const glw::GLfloat)de::max(correctWidth, correctHeight);
	const glw::GLint   maxLevels	  = (const glw::GLint)floor(log(maxTextureSize) / log(2.0f)) + 1;

	gl.texStorage3D(GL_TEXTURE_CUBE_MAP_ARRAY, maxLevels + 1, /* levels */
					GL_RGBA8,								  /* internalformat*/
					correctWidth, correctHeight, correctDepth);

	if (!checkError(GL_INVALID_OPERATION, "glTexStorage3D() call generated an invalid error code when levels argument "
										  "was greater than floor(log2(max(width, height))) + 1 - "))
	{
		result = false;
	}

	deleteTexture();

	/* Set Test Result */
	if (result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}